

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O3

Res_Sim_t * Res_SimAlloc(int nWords)

{
  int iVar1;
  Res_Sim_t *pRVar2;
  void **ppvVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Vec_t *pVVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  size_t __size;
  
  pRVar2 = (Res_Sim_t *)calloc(1,0x68);
  pRVar2->nWords = nWords;
  iVar1 = nWords * 0x20;
  pRVar2->nPats = iVar1;
  pRVar2->nWordsIn = iVar1;
  pRVar2->nBytesIn = nWords << 7;
  pRVar2->nPatsIn = nWords << 10;
  iVar10 = iVar1 * nWords;
  pRVar2->nWordsOut = iVar10;
  pRVar2->nPatsOut = iVar1 * iVar1;
  ppvVar3 = (void **)malloc(((long)iVar1 + 2) * 0x1000);
  lVar4 = 0x2000;
  lVar8 = 0;
  do {
    ppvVar3[lVar8] = (void *)((long)ppvVar3 + lVar4);
    lVar8 = lVar8 + 1;
    lVar4 = lVar4 + (long)iVar1 * 4;
  } while (lVar8 != 0x400);
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 0x400;
  pVVar5->nSize = 0x400;
  pVVar5->pArray = ppvVar3;
  pRVar2->vPats = pVVar5;
  __size = (long)nWords * 0x200 + 0x400;
  ppvVar3 = (void **)malloc(__size);
  lVar9 = (long)nWords * 4;
  lVar4 = 0x400;
  lVar8 = 0;
  do {
    ppvVar3[lVar8] = (void *)((long)ppvVar3 + lVar4);
    lVar8 = lVar8 + 1;
    lVar4 = lVar4 + lVar9;
  } while (lVar8 != 0x80);
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 0x80;
  pVVar5->nSize = 0x80;
  pVVar5->pArray = ppvVar3;
  pRVar2->vPats0 = pVVar5;
  ppvVar3 = (void **)malloc(__size);
  lVar4 = 0x400;
  lVar8 = 0;
  do {
    ppvVar3[lVar8] = (void *)((long)ppvVar3 + lVar4);
    lVar8 = lVar8 + 1;
    lVar4 = lVar4 + lVar9;
  } while (lVar8 != 0x80);
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 0x80;
  pVVar5->nSize = 0x80;
  pVVar5->pArray = ppvVar3;
  pRVar2->vPats1 = pVVar5;
  ppvVar3 = (void **)malloc(((long)iVar10 | 2U) << 9);
  lVar4 = 0x400;
  lVar8 = 0;
  do {
    ppvVar3[lVar8] = (void *)((long)ppvVar3 + lVar4);
    lVar8 = lVar8 + 1;
    lVar4 = lVar4 + (long)iVar10 * 4;
  } while (lVar8 != 0x80);
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 0x80;
  pVVar5->nSize = 0x80;
  pVVar5->pArray = ppvVar3;
  pRVar2->vOuts = pVVar5;
  pVVar6 = (Vec_Vec_t *)malloc(0x10);
  pVVar6->nCap = 0x10;
  ppvVar3 = (void **)malloc(0x80);
  pVVar6->pArray = ppvVar3;
  lVar4 = 0;
  do {
    pvVar7 = calloc(1,0x10);
    ppvVar3[lVar4] = pvVar7;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  pVVar6->nSize = 0x10;
  pRVar2->vCands = pVVar6;
  return pRVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocate simulation engine.]

  Description []
               
  SideEffects []

  SeeAlso     []
 
***********************************************************************/
Res_Sim_t * Res_SimAlloc( int nWords )
{
    Res_Sim_t * p;
    p = ABC_ALLOC( Res_Sim_t, 1 );
    memset( p, 0, sizeof(Res_Sim_t) );
    // simulation parameters
    p->nWords    = nWords;
    p->nPats     = p->nWords * 8 * sizeof(unsigned);
    p->nWordsIn  = p->nPats;
    p->nBytesIn  = p->nPats * sizeof(unsigned);
    p->nPatsIn   = p->nPats * 8 * sizeof(unsigned);
    p->nWordsOut = p->nPats * p->nWords;
    p->nPatsOut  = p->nPats * p->nPats;
    // simulation info
    p->vPats     = Vec_PtrAllocSimInfo( 1024, p->nWordsIn );
    p->vPats0    = Vec_PtrAllocSimInfo( 128, p->nWords );
    p->vPats1    = Vec_PtrAllocSimInfo( 128, p->nWords );
    p->vOuts     = Vec_PtrAllocSimInfo( 128, p->nWordsOut );
    // resub candidates
    p->vCands    = Vec_VecStart( 16 );
    return p;
}